

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_overrideCParams(ZSTD_compressionParameters *cParams,ZSTD_compressionParameters *overrides)

{
  if (overrides->windowLog != 0) {
    cParams->windowLog = overrides->windowLog;
  }
  if (overrides->hashLog != 0) {
    cParams->hashLog = overrides->hashLog;
  }
  if (overrides->chainLog != 0) {
    cParams->chainLog = overrides->chainLog;
  }
  if (overrides->searchLog != 0) {
    cParams->searchLog = overrides->searchLog;
  }
  if (overrides->minMatch != 0) {
    cParams->minMatch = overrides->minMatch;
  }
  if (overrides->targetLength != 0) {
    cParams->targetLength = overrides->targetLength;
  }
  if (overrides->strategy != 0) {
    cParams->strategy = overrides->strategy;
  }
  return;
}

Assistant:

static void ZSTD_overrideCParams(
              ZSTD_compressionParameters* cParams,
        const ZSTD_compressionParameters* overrides)
{
    if (overrides->windowLog)    cParams->windowLog    = overrides->windowLog;
    if (overrides->hashLog)      cParams->hashLog      = overrides->hashLog;
    if (overrides->chainLog)     cParams->chainLog     = overrides->chainLog;
    if (overrides->searchLog)    cParams->searchLog    = overrides->searchLog;
    if (overrides->minMatch)     cParams->minMatch     = overrides->minMatch;
    if (overrides->targetLength) cParams->targetLength = overrides->targetLength;
    if (overrides->strategy)     cParams->strategy     = overrides->strategy;
}